

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O3

int llex(LexState *ls,SemInfo *seminfo)

{
  size_t *psVar1;
  ZIO *pZVar2;
  size_t __n;
  byte *pbVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  TString *pTVar9;
  size_t sVar10;
  size_t sVar11;
  char *pcVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  Mbuffer *pMVar16;
  uint uVar17;
  bool bVar18;
  char local_38 [8];
  
  ls->buff->n = 0;
LAB_00131b0a:
  uVar4 = ls->current;
  switch(uVar4) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x21:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x3b:
  case 0x3f:
    goto switchD_00131b21_caseD_0;
  case 9:
  case 0xb:
  case 0xc:
  case 0x20:
    pZVar2 = ls->z;
    sVar10 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar10 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    goto LAB_00131b0a;
  case 10:
  case 0xd:
    inclinenumber(ls);
    goto LAB_00131b0a;
  case 0x22:
  case 0x27:
    save(ls,uVar4);
    pZVar2 = ls->z;
    sVar10 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar10 == 0) {
      uVar5 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar5 = (uint)*pbVar3;
    }
    ls->current = uVar5;
    goto joined_r0x00131dd1;
  case 0x2d:
    pZVar2 = ls->z;
    sVar10 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar10 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    if (uVar4 != 0x2d) {
      return 0x2d;
    }
    pZVar2 = ls->z;
    sVar10 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar10 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    if (uVar4 == 0x5b) {
      sVar10 = skip_sep(ls);
      ls->buff->n = 0;
      if (sVar10 < 2) {
        uVar4 = ls->current;
        goto LAB_00131c01;
      }
      read_long_string(ls,(SemInfo *)0x0,sVar10);
      ls->buff->n = 0;
    }
    else {
LAB_00131c01:
      while ((0xe < uVar4 + 1 || ((0x4801U >> (uVar4 + 1 & 0x1f) & 1) == 0))) {
        pZVar2 = ls->z;
        sVar10 = pZVar2->n;
        pZVar2->n = pZVar2->n - 1;
        if (sVar10 == 0) {
          uVar4 = luaZ_fill(pZVar2);
        }
        else {
          pbVar3 = (byte *)pZVar2->p;
          pZVar2->p = (char *)(pbVar3 + 1);
          uVar4 = (uint)*pbVar3;
        }
        ls->current = uVar4;
      }
    }
    goto LAB_00131b0a;
  case 0x2e:
    save(ls,0x2e);
    pZVar2 = ls->z;
    sVar10 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar10 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    iVar8 = check_next1(ls,0x2e);
    if (iVar8 != 0) {
      iVar8 = check_next1(ls,0x2e);
      return 0x11a - (uint)(iVar8 == 0);
    }
    if ((""[(long)ls->current + 1] & 2) == 0) {
      return 0x2e;
    }
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    iVar8 = read_numeral(ls,seminfo);
    return iVar8;
  case 0x2f:
    pZVar2 = ls->z;
    sVar10 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar10 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    iVar7 = 0x2f;
    iVar8 = check_next1(ls,0x2f);
    bVar18 = iVar8 == 0;
    iVar8 = 0x118;
    break;
  case 0x3a:
    pZVar2 = ls->z;
    sVar10 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar10 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    iVar7 = 0x3a;
    iVar8 = check_next1(ls,0x3a);
    bVar18 = iVar8 == 0;
    iVar8 = 0x121;
    break;
  case 0x3c:
    pZVar2 = ls->z;
    sVar10 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar10 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    iVar8 = check_next1(ls,0x3d);
    if (iVar8 != 0) {
      return 0x11d;
    }
    iVar7 = 0x3c;
    iVar8 = check_next1(ls,0x3c);
    bVar18 = iVar8 == 0;
    iVar8 = 0x11f;
    break;
  case 0x3d:
    pZVar2 = ls->z;
    sVar10 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar10 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    iVar7 = 0x3d;
    iVar8 = check_next1(ls,0x3d);
    bVar18 = iVar8 == 0;
    iVar8 = 0x11b;
    break;
  case 0x3e:
    pZVar2 = ls->z;
    sVar10 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar10 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    iVar8 = check_next1(ls,0x3d);
    if (iVar8 != 0) {
      return 0x11c;
    }
    iVar7 = 0x3e;
    iVar8 = check_next1(ls,0x3e);
    bVar18 = iVar8 == 0;
    iVar8 = 0x120;
    break;
  case 0x40:
    save(ls,0x40);
    pZVar2 = ls->z;
    sVar10 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar10 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    while ((""[(long)(int)uVar4 + 1] & 3) != 0) {
      save(ls,uVar4);
      pZVar2 = ls->z;
      sVar10 = pZVar2->n;
      pZVar2->n = pZVar2->n - 1;
      if (sVar10 == 0) {
        uVar4 = luaZ_fill(pZVar2);
      }
      else {
        pbVar3 = (byte *)pZVar2->p;
        pZVar2->p = (char *)(pbVar3 + 1);
        uVar4 = (uint)*pbVar3;
      }
      ls->current = uVar4;
    }
    check_save_next1(ls,0x5b);
    check_save_next1(ls,0x5d);
    pMVar16 = ls->buff;
    pcVar12 = pMVar16->buffer;
    __n = pMVar16->n;
    iVar8 = strncmp(pcVar12,"@integer",__n);
    sVar11 = __n;
    if (iVar8 == 0) {
      iVar8 = 0x127;
    }
    else {
      iVar8 = strncmp(pcVar12,"@integer[]",__n);
      if (iVar8 == 0) {
        iVar8 = 0x129;
      }
      else {
        iVar8 = strncmp(pcVar12,"@number",__n);
        if (iVar8 == 0) {
          iVar8 = 0x128;
        }
        else {
          iVar8 = strncmp(pcVar12,"@number[]",__n);
          if (iVar8 == 0) {
            iVar8 = 0x12a;
          }
          else {
            iVar8 = strncmp(pcVar12,"@table",__n);
            if (iVar8 == 0) {
              iVar8 = 299;
            }
            else {
              iVar8 = strncmp(pcVar12,"@string",__n);
              if (iVar8 == 0) {
                iVar8 = 300;
              }
              else {
                iVar8 = strncmp(pcVar12,"@closure",__n);
                if (iVar8 == 0) {
                  iVar8 = 0x12d;
                }
                else {
                  pTVar9 = luaX_newstring(ls,pcVar12 + 1,__n - 1);
                  seminfo->ts = pTVar9;
                  iVar8 = 0x40;
                  pMVar16 = ls->buff;
                  sVar11 = pMVar16->n;
                }
              }
            }
          }
        }
      }
    }
    pMVar16->n = sVar11 - __n;
    return iVar8;
  case 0xffffffff:
    return 0x122;
  default:
    if (uVar4 != 0x5b) {
      if (uVar4 == 0x7e) {
        pZVar2 = ls->z;
        sVar10 = pZVar2->n;
        pZVar2->n = pZVar2->n - 1;
        if (sVar10 == 0) {
          uVar4 = luaZ_fill(pZVar2);
        }
        else {
          pbVar3 = (byte *)pZVar2->p;
          pZVar2->p = (char *)(pbVar3 + 1);
          uVar4 = (uint)*pbVar3;
        }
        ls->current = uVar4;
        iVar8 = check_next1(ls,0x3d);
        if (iVar8 == 0) {
          return 0x7e;
        }
        return 0x11e;
      }
switchD_00131b21_caseD_0:
      if ((""[(long)(int)uVar4 + 1] & 1) == 0) {
        pZVar2 = ls->z;
        sVar10 = pZVar2->n;
        pZVar2->n = pZVar2->n - 1;
        if (sVar10 == 0) {
          uVar5 = luaZ_fill(pZVar2);
        }
        else {
          pbVar3 = (byte *)pZVar2->p;
          pZVar2->p = (char *)(pbVar3 + 1);
          uVar5 = (uint)*pbVar3;
        }
        ls->current = uVar5;
        return uVar4;
      }
      do {
        save(ls,uVar4);
        pZVar2 = ls->z;
        sVar10 = pZVar2->n;
        pZVar2->n = pZVar2->n - 1;
        if (sVar10 == 0) {
          uVar4 = luaZ_fill(pZVar2);
        }
        else {
          pbVar3 = (byte *)pZVar2->p;
          pZVar2->p = (char *)(pbVar3 + 1);
          uVar4 = (uint)*pbVar3;
        }
        ls->current = uVar4;
      } while ((""[(long)(int)uVar4 + 1] & 3) != 0);
      pTVar9 = luaX_newstring(ls,ls->buff->buffer,ls->buff->n);
      seminfo->ts = pTVar9;
      if (pTVar9->tt == '\x04') {
        if (pTVar9->extra != 0) {
          return pTVar9->extra | 0x100;
        }
        return 0x125;
      }
      return 0x125;
    }
    sVar10 = skip_sep(ls);
    if (1 < sVar10) {
      read_long_string(ls,seminfo,sVar10);
      return 0x126;
    }
    if (sVar10 != 0) {
      return 0x5b;
    }
    pcVar12 = "invalid long string delimiter";
    goto LAB_00132632;
  }
  if (bVar18) {
    return iVar7;
  }
  return iVar8;
joined_r0x00131dd1:
  if (uVar5 == uVar4) {
    save(ls,uVar4);
    pZVar2 = ls->z;
    sVar10 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar10 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    pTVar9 = luaX_newstring(ls,ls->buff->buffer + 1,ls->buff->n - 2);
    seminfo->ts = pTVar9;
    return 0x126;
  }
  if ((int)uVar5 < 0x5c) {
    if (uVar5 == 0xffffffff) {
      pcVar12 = "unfinished string";
      iVar8 = 0x122;
      goto LAB_00132645;
    }
    if ((uVar5 == 10) || (uVar5 == 0xd)) {
      pcVar12 = "unfinished string";
LAB_00132632:
      iVar8 = 0x126;
LAB_00132645:
      lexerror(ls,pcVar12,iVar8);
    }
LAB_00131e4c:
    save(ls,uVar5);
    pZVar2 = ls->z;
    sVar10 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar10 == 0) {
      uVar5 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar5 = (uint)*pbVar3;
    }
    ls->current = uVar5;
  }
  else {
    if (uVar5 != 0x5c) goto LAB_00131e4c;
    save(ls,0x5c);
    pZVar2 = ls->z;
    sVar10 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar10 == 0) {
      uVar5 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar5 = (uint)*pbVar3;
    }
    ls->current = uVar5;
    if ((int)uVar5 < 0x62) {
      if ((int)uVar5 < 0x22) {
        if (uVar5 == 0xffffffff) goto LAB_001320c0;
        if ((uVar5 != 10) && (uVar5 != 0xd)) goto switchD_00131eb6_caseD_6f;
        inclinenumber(ls);
        uVar13 = 10;
      }
      else {
        uVar13 = uVar5;
        if ((int)uVar5 < 0x5c) {
          if ((uVar5 == 0x22) || (uVar5 == 0x27)) goto LAB_0013208b;
        }
        else if ((uVar5 == 0x5c) || (uVar13 = 7, uVar5 == 0x61)) goto LAB_0013208b;
switchD_00131eb6_caseD_6f:
        esccheck(ls,""[(long)(int)uVar5 + 1] & 2,"invalid escape sequence");
        uVar13 = 0;
        uVar17 = 0;
        uVar5 = ls->current;
        do {
          if ((""[(long)(int)uVar5 + 1] & 2) == 0) goto LAB_00131f94;
          save(ls,uVar5);
          pZVar2 = ls->z;
          sVar10 = pZVar2->n;
          pZVar2->n = pZVar2->n - 1;
          if (sVar10 == 0) {
            uVar6 = luaZ_fill(pZVar2);
          }
          else {
            pbVar3 = (byte *)pZVar2->p;
            pZVar2->p = (char *)(pbVar3 + 1);
            uVar6 = (uint)*pbVar3;
          }
          uVar17 = uVar17 + 1;
          ls->current = uVar6;
          uVar13 = (uVar5 - 0x30) + uVar13 * 10;
          uVar5 = uVar6;
        } while (uVar17 != 3);
        uVar17 = 3;
LAB_00131f94:
        esccheck(ls,(uint)((int)uVar13 < 0x100),"decimal escape too large");
        psVar1 = &ls->buff->n;
        *psVar1 = *psVar1 - (ulong)uVar17;
      }
    }
    else {
      switch(uVar5) {
      case 0x6e:
        uVar13 = 10;
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
      case 0x77:
      case 0x79:
        goto switchD_00131eb6_caseD_6f;
      case 0x72:
        uVar13 = 0xd;
        break;
      case 0x74:
        uVar13 = 9;
        break;
      case 0x75:
        save(ls,0x75);
        pZVar2 = ls->z;
        sVar10 = pZVar2->n;
        pZVar2->n = pZVar2->n - 1;
        if (sVar10 == 0) {
          uVar5 = luaZ_fill(pZVar2);
        }
        else {
          pbVar3 = (byte *)pZVar2->p;
          pZVar2->p = (char *)(pbVar3 + 1);
          uVar5 = (uint)*pbVar3;
        }
        ls->current = uVar5;
        esccheck(ls,(uint)(uVar5 == 0x7b),"missing \'{\'");
        iVar8 = gethexa(ls);
        uVar14 = (ulong)iVar8;
        lVar15 = -4;
        while( true ) {
          save(ls,ls->current);
          pZVar2 = ls->z;
          sVar10 = pZVar2->n;
          pZVar2->n = pZVar2->n - 1;
          if (sVar10 == 0) {
            uVar5 = luaZ_fill(pZVar2);
          }
          else {
            pbVar3 = (byte *)pZVar2->p;
            pZVar2->p = (char *)(pbVar3 + 1);
            uVar5 = (uint)*pbVar3;
          }
          ls->current = uVar5;
          if ((""[(long)(int)uVar5 + 1] & 0x10) == 0) break;
          esccheck(ls,(uint)(uVar14 < 0x8000000),"UTF-8 value too large");
          iVar8 = luaO_hexavalue(ls->current);
          lVar15 = lVar15 + -1;
          uVar14 = uVar14 * 0x10 + (long)iVar8;
        }
        esccheck(ls,(uint)(uVar5 == 0x7d),"missing \'}\'");
        pZVar2 = ls->z;
        sVar10 = pZVar2->n;
        pZVar2->n = pZVar2->n - 1;
        if (sVar10 == 0) {
          uVar5 = luaZ_fill(pZVar2);
        }
        else {
          pbVar3 = (byte *)pZVar2->p;
          pZVar2->p = (char *)(pbVar3 + 1);
          uVar5 = (uint)*pbVar3;
        }
        ls->current = uVar5;
        psVar1 = &ls->buff->n;
        *psVar1 = *psVar1 + lVar15;
        uVar5 = luaO_utf8esc(local_38,uVar14);
        if (0 < (int)uVar5) {
          pcVar12 = &stack0xffffffffffffffd0 + -(ulong)uVar5;
          uVar14 = (ulong)uVar5 + 1;
          do {
            save(ls,(int)*pcVar12);
            uVar14 = uVar14 - 1;
            pcVar12 = pcVar12 + 1;
          } while (1 < uVar14);
        }
        goto LAB_001320c0;
      case 0x76:
        uVar13 = 0xb;
        break;
      case 0x78:
        iVar8 = gethexa(ls);
        iVar7 = gethexa(ls);
        psVar1 = &ls->buff->n;
        *psVar1 = *psVar1 - 2;
        uVar13 = iVar7 + iVar8 * 0x10;
        break;
      case 0x7a:
        psVar1 = &ls->buff->n;
        *psVar1 = *psVar1 - 1;
        do {
          pZVar2 = ls->z;
          sVar10 = pZVar2->n;
          pZVar2->n = pZVar2->n - 1;
          if (sVar10 == 0) {
            uVar5 = luaZ_fill(pZVar2);
          }
          else {
            pbVar3 = (byte *)pZVar2->p;
            pZVar2->p = (char *)(pbVar3 + 1);
            uVar5 = (uint)*pbVar3;
          }
          ls->current = uVar5;
          while( true ) {
            if ((""[(long)(int)uVar5 + 1] & 8) == 0) goto LAB_001320c0;
            if ((uVar5 != 0xd) && (uVar5 != 10)) break;
            inclinenumber(ls);
            uVar5 = ls->current;
          }
        } while( true );
      default:
        if (uVar5 == 0x66) {
          uVar13 = 0xc;
        }
        else {
          if (uVar5 != 0x62) goto switchD_00131eb6_caseD_6f;
          uVar13 = 8;
        }
      }
LAB_0013208b:
      pZVar2 = ls->z;
      sVar10 = pZVar2->n;
      pZVar2->n = pZVar2->n - 1;
      if (sVar10 == 0) {
        uVar5 = luaZ_fill(pZVar2);
      }
      else {
        pbVar3 = (byte *)pZVar2->p;
        pZVar2->p = (char *)(pbVar3 + 1);
        uVar5 = (uint)*pbVar3;
      }
      ls->current = uVar5;
    }
    psVar1 = &ls->buff->n;
    *psVar1 = *psVar1 - 1;
    save(ls,uVar13);
  }
LAB_001320c0:
  uVar5 = ls->current;
  goto joined_r0x00131dd1;
}

Assistant:

static int llex (LexState *ls, SemInfo *seminfo) {
  luaZ_resetbuffer(ls->buff);
  for (;;) {
    switch (ls->current) {
      case '\n': case '\r': {  /* line breaks */
        inclinenumber(ls);
        break;
      }
      case ' ': case '\f': case '\t': case '\v': {  /* spaces */
        next(ls);
        break;
      }
      case '-': {  /* '-' or '--' (comment) */
        next(ls);
        if (ls->current != '-') return '-';
        /* else is a comment */
        next(ls);
        if (ls->current == '[') {  /* long comment? */
          size_t sep = skip_sep(ls);
          luaZ_resetbuffer(ls->buff);  /* 'skip_sep' may dirty the buffer */
          if (sep >= 2) {
            read_long_string(ls, NULL, sep);  /* skip long comment */
            luaZ_resetbuffer(ls->buff);  /* previous call may dirty the buff. */
            break;
          }
        }
        /* else short comment */
        while (!currIsNewline(ls) && ls->current != EOZ)
          next(ls);  /* skip until end of line (or end of file) */
        break;
      }
      case '[': {  /* long string or simply '[' */
        size_t sep = skip_sep(ls);
        if (sep >= 2) {
          read_long_string(ls, seminfo, sep);
          return TK_STRING;
        }
        else if (sep == 0)  /* '[=...' missing second bracket? */
          lexerror(ls, "invalid long string delimiter", TK_STRING);
        return '[';
      }
      case '=': {
        next(ls);
        if (check_next1(ls, '=')) return TK_EQ;
        else return '=';
      }
      case '<': {
        next(ls);
        if (check_next1(ls, '=')) return TK_LE;
        else if (check_next1(ls, '<')) return TK_SHL;
        else return '<';
      }
      case '>': {
        next(ls);
        if (check_next1(ls, '=')) return TK_GE;
        else if (check_next1(ls, '>')) return TK_SHR;
        else return '>';
      }
      case '/': {
        next(ls);
        if (check_next1(ls, '/')) return TK_IDIV;
        else return '/';
      }
      case '~': {
        next(ls);
        if (check_next1(ls, '=')) return TK_NE;
        else return '~';
      }
      case ':': {
        next(ls);
        if (check_next1(ls, ':')) return TK_DBCOLON;
        else return ':';
      }
      case '"': case '\'': {  /* short literal strings */
        read_string(ls, ls->current, seminfo);
        return TK_STRING;
      }
      case '.': {  /* '.', '..', '...', or number */
        save_and_next(ls);
        if (check_next1(ls, '.')) {
          if (check_next1(ls, '.'))
            return TK_DOTS;   /* '...' */
          else return TK_CONCAT;   /* '..' */
        }
        else if (!lisdigit(ls->current)) return '.';
        else return read_numeral(ls, seminfo);
      }
      case '0': case '1': case '2': case '3': case '4':
      case '5': case '6': case '7': case '8': case '9': {
        return read_numeral(ls, seminfo);
      }
      case EOZ: {
        return TK_EOS;
      }
      case '@': {
        /* RAVI change: @ introduces a type assertion operator */
        save_and_next(ls);
        while (lislalnum(ls->current)) {
          save_and_next(ls);
        }
        check_save_next1(ls, '[');
        check_save_next1(ls, ']');
        return casttoken(ls, seminfo);
      }
      default: {
        if (lislalpha(ls->current)) {  /* identifier or reserved word? */
          TString *ts;
          do {
            save_and_next(ls);
          } while (lislalnum(ls->current));
          ts = luaX_newstring(ls, luaZ_buffer(ls->buff),
                                  luaZ_bufflen(ls->buff));
          seminfo->ts = ts;
          if (isreserved(ts))  /* reserved word? */
            return ts->extra - 1 + FIRST_RESERVED;
          else {
            return TK_NAME;
          }
        }
        else {  /* single-char tokens (+ - / ...) */
          int c = ls->current;
          next(ls);
          return c;
        }
      }
    }
  }
}